

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O0

void * __thiscall
BitSetImplement<std::bitset<16000UL>,_KDefectiveRDS>::setUnion
          (BitSetImplement<std::bitset<16000UL>,_KDefectiveRDS> *this,void *A,void *B)

{
  bitset<16000UL> *this_00;
  bitset<16000UL> local_808;
  bitset<16000UL> *local_38;
  bitset<16000UL> *__C__;
  bitset<16000UL> *__B__;
  bitset<16000UL> *__A__;
  void *B_local;
  void *A_local;
  BitSetImplement<std::bitset<16000UL>,_KDefectiveRDS> *this_local;
  
  __C__ = (bitset<16000UL> *)B;
  __B__ = (bitset<16000UL> *)A;
  __A__ = (bitset<16000UL> *)B;
  B_local = A;
  A_local = this;
  this_00 = (bitset<16000UL> *)operator_new(2000);
  std::bitset<16000UL>::bitset(this_00);
  local_38 = this_00;
  std::operator|(&local_808,__B__,__C__);
  memcpy(local_38,&local_808,2000);
  return local_38;
}

Assistant:

void* BitSetImplement<Bitset, Base>::setUnion(void *A, void *B) {
	Bitset *__A__ = (Bitset*) A, *__B__ = (Bitset*) B, *__C__ = new Bitset();
	*__C__ = (*__A__) | (*__B__);
	return __C__;
}